

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GenNativeStructPack
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  local_28 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)struct_def;
  struct_def_local = (StructDef *)this;
  NativeName_abi_cxx11_(&local_88,this,struct_def);
  std::operator+(&local_68,"func (t *",&local_88);
  std::operator+(&local_48,&local_68,") Pack(builder *flatbuffers.Builder) flatbuffers.UOffsetT {\n"
                );
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::operator+=((string *)local_28,"\tif t == nil {\n\t\treturn 0\n\t}\n");
  IdlNamer::Type_abi_cxx11_(&local_f8,&this->namer_,(StructDef *)code_ptr_local);
  std::operator+(&local_d8,"\treturn Create",&local_f8);
  std::operator+(&local_b8,&local_d8,"(builder");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  StructPackArgs(this,(StructDef *)code_ptr_local,"",code);
  std::__cxx11::string::operator+=((string *)local_28,")\n");
  std::__cxx11::string::operator+=((string *)local_28,"}\n");
  return;
}

Assistant:

void GenNativeStructPack(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += "func (t *" + NativeName(struct_def) +
            ") Pack(builder *flatbuffers.Builder) flatbuffers.UOffsetT {\n";
    code += "\tif t == nil {\n\t\treturn 0\n\t}\n";
    code += "\treturn Create" + namer_.Type(struct_def) + "(builder";
    StructPackArgs(struct_def, "", code_ptr);
    code += ")\n";
    code += "}\n";
  }